

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incgamma.cpp
# Opt level: O0

double numerary::Numerary::incgamma(double *a,double *x,double *eps)

{
  double dVar1;
  double dVar2;
  undefined4 local_34;
  double dStack_30;
  int n;
  double sum;
  double term;
  double *eps_local;
  double *x_local;
  double *a_local;
  
  dStack_30 = 0.0;
  local_34 = 1;
  for (sum = 1.0 / *a; *eps <= sum && sum != *eps; sum = sum * (*x / (*a + dVar2))) {
    dStack_30 = dStack_30 + sum;
    dVar2 = (double)local_34;
    local_34 = local_34 + 1;
  }
  dVar2 = pow(*x,*a);
  dVar1 = exp(*x * -1.0);
  return dVar2 * dVar1 * dStack_30;
}

Assistant:

double Numerary::incgamma(const double& a, const double& x, const double& eps)
    {
        double term=1.0/a, sum = 0;
        int n=1;
        while (term > eps) {
            sum = sum + term;
            term = term*(x/(a+n));
            n++;
        }

        return pow(x,a)*exp(-1*x)*sum;
    }